

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadMessage.cpp
# Opt level: O0

ReadMessage * __thiscall ReadMessage::execute_abi_cxx11_(ReadMessage *this)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  DIR *__dirp;
  dirent *pdVar4;
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338 [36];
  undefined4 local_314;
  string local_310 [32];
  string local_2f0 [8];
  string line;
  string local_2d0 [8];
  ifstream messageFile;
  dirent *userDirEntry;
  DIR *userDir;
  string local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [8];
  string dir;
  int local_50;
  int count;
  allocator local_39;
  string local_38 [8];
  string result;
  ReadMessage *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_50 = 0;
  pcVar3 = *(char **)(in_RSI + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,pcVar3,(allocator *)((long)&userDir + 7));
  std::operator+(local_90,(char *)local_b0);
  std::operator+(local_70,local_90);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&userDir + 7));
  pcVar3 = (char *)std::__cxx11::string::c_str();
  __dirp = opendir(pcVar3);
  std::ifstream::ifstream(local_2d0);
  std::__cxx11::string::string(local_2f0);
  if (__dirp == (DIR *)0x0) {
    std::__cxx11::string::operator=((string *)(in_RSI + 8),(char *)(in_RSI + 0x3a));
    closedir((DIR *)0x0);
    std::operator+((char *)local_310,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "No such User \"");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   (char *)local_310);
    std::__cxx11::string::~string(local_310);
  }
  else {
    while( true ) {
      pdVar4 = readdir(__dirp);
      bVar2 = false;
      if (pdVar4 != (dirent *)0x0) {
        bVar2 = local_50 <= *(int *)(in_RSI + 0x68);
      }
      if (!bVar2) break;
      if (pdVar4->d_type == '\b') {
        std::operator+(local_358,(char *)local_70);
        std::operator+(local_338,(char *)local_358);
        std::ifstream::open(local_2d0,(_Ios_Openmode)local_338);
        std::__cxx11::string::~string((string *)local_338);
        std::__cxx11::string::~string((string *)local_358);
        bVar1 = std::ifstream::is_open();
        if ((bVar1 & 1) != 0) {
          local_50 = local_50 + 1;
          if (local_50 == *(int *)(in_RSI + 0x68)) {
            while (bVar1 = std::ios::eof(), ((bVar1 ^ 0xff) & 1) != 0) {
              std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)local_2d0,local_2f0);
              std::__cxx11::string::append(local_38);
              std::__cxx11::string::append((char *)local_38);
            }
          }
          std::ifstream::close();
        }
      }
    }
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,"");
    if (bVar2) {
      std::__cxx11::string::operator=((string *)(in_RSI + 8),(char *)(in_RSI + 0x3a));
      std::__cxx11::string::operator=(local_38,"No matching file found.\n");
    }
    std::__cxx11::string::operator=((string *)(in_RSI + 8),(char *)(in_RSI + 0x36));
    closedir(__dirp);
    std::__cxx11::string::string((string *)this,local_38);
  }
  local_314 = 1;
  std::__cxx11::string::~string(local_2f0);
  std::ifstream::~ifstream(local_2d0);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string(local_38);
  return this;
}

Assistant:

string ReadMessage::execute() {
    string result = "";
    int count = 0;
    string dir = string(MESSAGEDIR) + "/" + User;

    DIR* userDir = opendir(dir.c_str()); //Open User Directory

    struct dirent * userDirEntry; //individual entries in the directory.
    ifstream messageFile;
    string line;

    //if no directory found return 0
    if(userDir == nullptr){
        statusMessage = FAILURE;
        closedir(userDir);
        return "No such User \"" + User + "\" found\n";
    }

    //while directory isn't empty or didn't reach right file keep looking:
    while((userDirEntry = readdir(userDir)) != nullptr && count <= MessageNumber){
        //only read regular files
        if(userDirEntry->d_type == DT_REG){
            //ToDo: look if filename ends with .msg or .txt
            messageFile.open(dir + "/" + userDirEntry->d_name);
            if(messageFile.is_open()){
                //count as countable file
                count ++;
                if(count == MessageNumber){
                    //reading if reached right file
                    while(!messageFile.eof()){
                        //read till the end and save lines to the result:
                        getline(messageFile, line);
                        result.append(line);
                        result.append("\n");
                    }
                }
                //close file again
                messageFile.close();
            }
        }
    }

    if(result == ""){
        statusMessage = FAILURE;
        result = "No matching file found.\n";
    }

    statusMessage = SUCCESS;
    closedir(userDir);
    return result;
}